

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsReader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::MhsReader::~MhsReader(MhsReader *this)

{
  ADIOS *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer ppEVar1;
  pointer ppIVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  ulong uVar6;
  size_type *psVar7;
  uint __val;
  uint __len;
  string __str;
  char *local_70 [2];
  char local_60 [16];
  string local_50;
  
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__MhsReader_008880c0;
  if (1 < this->m_Tiers) {
    __val = 1;
    do {
      __len = 1;
      if (9 < __val) {
        uVar6 = (ulong)__val;
        uVar3 = 4;
        do {
          __len = uVar3;
          uVar4 = (uint)uVar6;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_006d17fc;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_006d17fc;
          }
          if (uVar4 < 10000) goto LAB_006d17fc;
          uVar6 = uVar6 / 10000;
          uVar3 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_006d17fc:
      this_00 = ((this->super_Engine).m_IO)->m_ADIOS;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct((ulong)local_70,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_70[0],__len,__val);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x767414);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_50.field_2._M_allocated_capacity = *psVar7;
        local_50.field_2._8_8_ = plVar5[3];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar7;
        local_50._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_50._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ADIOS::RemoveIO(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      __val = __val + 1;
    } while ((int)__val < this->m_Tiers);
  }
  (this->super_Engine).m_IsOpen = false;
  this_01 = (this->m_SiriusCompressor).
            super___shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  ppEVar1 = (this->m_SubEngines).
            super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1);
  }
  ppIVar2 = (this->m_SubIOs).
            super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar2 != (pointer)0x0) {
    operator_delete(ppIVar2);
  }
  Engine::~Engine(&this->super_Engine);
  return;
}

Assistant:

MhsReader::~MhsReader()
{
    for (int i = 1; i < m_Tiers; ++i)
    {
        m_IO.m_ADIOS.RemoveIO("SubIO" + std::to_string(i));
    }
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}